

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.cpp
# Opt level: O3

Light_EvalRes * embree::SpotLight_eval(Light *super,DifferentialGeometry *dg,Vec3fa *dir)

{
  Light_EvalRes *res;
  Light_EvalRes *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  __m128 a;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  *(undefined8 *)&(in_RDI->value).field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
  in_RDI->dist = INFINITY;
  in_RDI->pdf = 0.0;
  fVar1 = (float)super[0x1a].type;
  if (0.0 < fVar1) {
    fVar3 = (dir->field_0).m128[1] * (float)super[0x11].type;
    fVar4 = (dir->field_0).m128[2] * (float)super[0x12].type;
    fVar5 = (dir->field_0).m128[3] * (float)super[0x13].type;
    fVar9 = fVar3 + (dir->field_0).m128[0] * (float)super[0x10].type + fVar4;
    fVar10 = fVar3 + fVar3 + fVar5;
    fVar2 = -fVar9;
    fVar4 = -(fVar3 + fVar4 + fVar4);
    fVar3 = -(fVar3 + fVar5 + fVar5);
    if ((float)super[0x18].type < fVar2) {
      fVar6 = (dg->P).field_0.m128[0] - (float)super[4].type;
      fVar7 = (dg->P).field_0.m128[1] - (float)super[5].type;
      fVar8 = (dg->P).field_0.m128[2] - (float)super[6].type;
      fVar5 = (float)super[0x12].type * fVar8 +
              (float)super[0x11].type * fVar7 + (float)super[0x10].type * fVar6;
      if (0.0 < fVar5) {
        auVar11._0_8_ = CONCAT44(fVar10,fVar2) ^ 0x8000000000000000;
        auVar11._8_4_ = fVar4;
        auVar11._12_4_ = fVar3;
        auVar12._8_4_ = fVar4;
        auVar12._0_8_ = CONCAT44(fVar10,fVar2) ^ 0x8000000000000000;
        auVar12._12_4_ = fVar3;
        auVar12 = rcpss(auVar11,auVar12);
        fVar5 = fVar5 * (fVar9 * auVar12._0_4_ + 2.0) * auVar12._0_4_;
        fVar6 = fVar6 + (dir->field_0).m128[0] * fVar5;
        fVar7 = fVar7 + (dir->field_0).m128[1] * fVar5;
        fVar8 = fVar8 + (dir->field_0).m128[2] * fVar5;
        if (fVar8 * fVar8 + fVar7 * fVar7 + fVar6 * fVar6 < fVar1 * fVar1) {
          fVar1 = (fVar2 - (float)super[0x18].type) * (float)super[0x19].type;
          if (1.0 <= fVar1) {
            fVar1 = 1.0;
          }
          fVar2 = (float)super[0x1b].type * fVar2;
          fVar1 = fVar1 * fVar2;
          fVar3 = (float)super[0x15].type;
          fVar4 = (float)super[0x16].type;
          fVar9 = (float)super[0x17].type;
          (in_RDI->value).field_0.m128[0] = fVar1 * (float)super[0x14].type;
          (in_RDI->value).field_0.m128[1] = fVar1 * fVar3;
          (in_RDI->value).field_0.m128[2] = fVar1 * fVar4;
          (in_RDI->value).field_0.m128[3] = fVar1 * fVar9;
          in_RDI->dist = fVar5;
          in_RDI->pdf = fVar5 * fVar5 * fVar2;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes SpotLight_eval(const Light* super,
                                                          const DifferentialGeometry& dg,
                                                          const Vec3fa& dir)
{
  const SpotLight* self = (SpotLight*)super;
  Light_EvalRes res;
  res.value = Vec3fa(0.0f);
  res.dist = inf;
  res.pdf = 0.0f;

  if (self->radius > 0.0f) {
    // intersect disk
    const float cosAngle = -dot(dir, self->frame.vz);
    if (cosAngle > self->cosAngleMax) { // inside illuminated cone?
      const Vec3fa vp = dg.P - self->position;
      const float dp = dot(vp, self->frame.vz);
      if (dp > 0.0f) { // in front of light?
        const float t = dp*rcp(cosAngle);
        const Vec3fa vd = vp + t * dir;
        if (dot(vd, vd) < sqr(self->radius)) { // inside disk?
          const float angularAttenuation = min((cosAngle - self->cosAngleMax) * self->cosAngleScale, 1.f);
          const float pdf = self->diskPdf * cosAngle;
          res.value = self->power * (angularAttenuation * pdf); // *sqr(t)/sqr(t) cancels
          res.dist = t;
          res.pdf = pdf * sqr(t);
        }
      }
    }
  }

  return res;
}